

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O1

_Bool effect_handler_GRANITE(effect_handler_context_t_conflict *context)

{
  uint32_t *puVar1;
  byte *pbVar2;
  trap *ptVar3;
  player_upkeep *ppVar4;
  chunk_conflict *c;
  _Bool daytime;
  
  ptVar3 = (context->origin).which.trap;
  square_set_feat(cave,ptVar3->grid,L'\x15');
  c = cave;
  if (cave->depth == 0) {
    daytime = is_daytime();
    expose_to_sun((chunk *)c,ptVar3->grid,daytime);
  }
  ppVar4 = player->upkeep;
  puVar1 = &ppVar4->update;
  *puVar1 = *puVar1 | 0x60;
  pbVar2 = (byte *)((long)&ppVar4->redraw + 2);
  *pbVar2 = *pbVar2 | 0xc0;
  return true;
}

Assistant:

bool effect_handler_GRANITE(effect_handler_context_t *context)
{
	struct trap *trap = context->origin.which.trap;
	square_set_feat(cave, trap->grid, FEAT_GRANITE);
	if (cave->depth == 0) expose_to_sun(cave, trap->grid, is_daytime());

	player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);
	player->upkeep->redraw |= (PR_MONLIST | PR_ITEMLIST);

	return true;
}